

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O0

void player_pickup_aux(player *p,object *obj,wchar_t auto_max,_Bool domsg)

{
  long lVar1;
  object *obj_00;
  object *picked_up;
  wchar_t local_28;
  wchar_t wStack_24;
  _Bool dummy;
  wchar_t num;
  wchar_t max;
  _Bool domsg_local;
  object *poStack_18;
  wchar_t auto_max_local;
  object *obj_local;
  player *p_local;
  
  num._3_1_ = domsg;
  max = auto_max;
  poStack_18 = obj;
  obj_local = (object *)p;
  wStack_24 = inven_carry_num(p,obj);
  if (wStack_24 == L'\0') {
    quit_fmt("Failed pickup of %s",poStack_18->kind->name);
  }
  lVar1 = *(long *)&obj_local[3].el_info[0x15].flags;
  *(uint *)(lVar1 + 0x30) = *(uint *)(lVar1 + 0x30) | 2;
  if ((max != L'\0') && (max < wStack_24)) {
    wStack_24 = max;
  }
  if (wStack_24 == (uint)poStack_18->number) {
    if (poStack_18->known != (object *)0x0) {
      square_excise_object
                ((chunk *)obj_local[1].effect,(loc_conflict)obj_local->artifact,poStack_18->known);
      delist_object((chunk_conflict *)obj_local[1].effect,poStack_18->known);
    }
    square_excise_object((chunk *)cave,(loc_conflict)obj_local->artifact,poStack_18);
    delist_object(cave,poStack_18);
    inven_carry((player *)obj_local,poStack_18,true,(_Bool)(num._3_1_ & 1));
  }
  else {
    if (max == L'\0') {
      local_28 = get_quantity((char *)0x0,wStack_24);
    }
    else {
      local_28 = max;
    }
    if (local_28 != L'\0') {
      obj_00 = floor_object_for_use
                         ((player *)obj_local,poStack_18,local_28,false,
                          (_Bool *)((long)&picked_up + 7));
      inven_carry((player *)obj_local,obj_00,true,(_Bool)(num._3_1_ & 1));
    }
  }
  return;
}

Assistant:

static void player_pickup_aux(struct player *p, struct object *obj,
							  int auto_max, bool domsg)
{
	int max = inven_carry_num(p, obj);

	/* Confirm at least some of the object can be picked up */
	if (max == 0)
		quit_fmt("Failed pickup of %s", obj->kind->name);

	/* Set ignore status */
	p->upkeep->notice |= PN_IGNORE;

	/* Allow auto-pickup to limit the number if it wants to */
	if (auto_max && max > auto_max) {
		max = auto_max;
	}

	/* Carry the object, prompting for number if necessary */
	if (max == obj->number) {
		if (obj->known) {
			square_excise_object(p->cave, p->grid, obj->known);
			delist_object(p->cave, obj->known);
		}
		square_excise_object(cave, p->grid, obj);
		delist_object(cave, obj);
		inven_carry(p, obj, true, domsg);
	} else {
		int num;
		bool dummy;
		struct object *picked_up;

		if (auto_max)
			num = auto_max;
		else
			num = get_quantity(NULL, max);
		if (!num) return;
		picked_up = floor_object_for_use(p, obj, num, false, &dummy);
		inven_carry(p, picked_up, true, domsg);
	}
}